

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QShaderDescription::UniformBlock>::appendInitialize
          (QArrayDataPointer<QShaderDescription::UniformBlock> *this,qsizetype newSize)

{
  UniformBlock *pUVar1;
  long in_RSI;
  UniformBlock *in_RDI;
  UniformBlock *e;
  UniformBlock *b;
  
  begin((QArrayDataPointer<QShaderDescription::UniformBlock> *)0x6ef5f0);
  pUVar1 = begin((QArrayDataPointer<QShaderDescription::UniformBlock> *)0x6ef606);
  std::uninitialized_value_construct<QShaderDescription::UniformBlock*>(pUVar1 + in_RSI,in_RDI);
  (in_RDI->blockName).d.size = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }